

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_debug_line_section.cpp
# Opt level: O1

void __thiscall
DebugLineSection_RoundTrip_Test::DebugLineSection_RoundTrip_Test
          (DebugLineSection_RoundTrip_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_DebugLineSection).super_Test._vptr_Test =
       (_func_int **)&PTR__DebugLineSection_0019b768;
  in_memory_store::in_memory_store(&(this->super_DebugLineSection).store_);
  pstore::database::database<pstore::file::in_memory>
            (&(this->super_DebugLineSection).db_,&(this->super_DebugLineSection).store_.file_,true);
  (this->super_DebugLineSection).db_.vacuum_mode_ = disabled;
  (this->super_DebugLineSection).super_Test._vptr_Test =
       (_func_int **)&PTR__DebugLineSection_0019b6f8;
  return;
}

Assistant:

TEST_F (DebugLineSection, RoundTrip) {
    using pstore::repo::debug_line_section_creation_dispatcher;

    constexpr auto section_type = pstore::repo::section_kind::debug_line;
    constexpr auto alignment = std::uint8_t{4};
    constexpr auto header_digest = pstore::index::digest{0x01234567U, 0x89ABCDEF};
    constexpr auto header_extent =
        pstore::make_extent (pstore::typed_address<std::uint8_t>::make (5), 7);

    pstore::repo::section_content content{section_type, alignment};
    content.data.emplace_back (std::uint8_t{11});
    content.data.emplace_back (std::uint8_t{13});

    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    dispatchers.emplace_back (
        new debug_line_section_creation_dispatcher (header_digest, header_extent, &content));

    transaction_type transaction = begin (db_, lock_guard{mutex_});
    auto fragment = pstore::repo::fragment::load (
        db_, pstore::repo::fragment::alloc (transaction,
                                            pstore::make_pointee_adaptor (dispatchers.begin ()),
                                            pstore::make_pointee_adaptor (dispatchers.end ())));
    transaction.commit ();

    auto const * const dls = fragment->atp<section_type> ();
    ASSERT_NE (dls, nullptr);
    EXPECT_EQ (dls->align (), alignment);
    EXPECT_EQ (dls->header_digest (), header_digest);
    EXPECT_EQ (dls->header_extent (), header_extent);
    EXPECT_THAT (dls->payload (), testing::ElementsAre (std::uint8_t{11}, std::uint8_t{13}));
}